

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O1

int __thiscall
SID::clock_resample_interpolate(SID *this,cycle_count *delta_t,short *buf,int n,int interleave)

{
  short *psVar1;
  int iVar2;
  long lVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int local_4c;
  
  iVar5 = 0;
  do {
    uVar12 = this->cycles_per_sample + this->sample_offset;
    iVar7 = (int)uVar12 >> 0x10;
    iVar8 = 2;
    iVar11 = local_4c;
    if ((iVar7 <= *delta_t) && (iVar8 = 1, iVar11 = iVar5, iVar5 < n)) {
      iVar11 = iVar7;
      if (0 < iVar7) {
        do {
          clock(this);
          iVar8 = (this->extfilt).Vo;
          lVar3 = (long)iVar8;
          sVar4 = (short)(uint)((ulong)(lVar3 * 0x2e8ba2e9) >> 0x21) - (short)(iVar8 >> 0x1f);
          if (lVar3 < -0x5800a) {
            sVar4 = -0x8000;
          }
          if (0x57fff < lVar3) {
            sVar4 = 0x7fff;
          }
          psVar1 = this->sample;
          iVar8 = this->sample_index;
          psVar1[(long)iVar8 + 0x4000] = sVar4;
          psVar1[iVar8] = sVar4;
          this->sample_index = iVar8 + 1U & 0x3fff;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      *delta_t = *delta_t - iVar7;
      uVar12 = uVar12 & 0xffff;
      this->sample_offset = uVar12;
      iVar11 = this->fir_RES;
      uVar12 = uVar12 * iVar11;
      iVar9 = (int)uVar12 >> 0x10;
      iVar8 = this->fir_N;
      lVar3 = (long)iVar8;
      iVar7 = 0;
      iVar6 = 0;
      if (0 < lVar3) {
        lVar10 = 0;
        iVar6 = 0;
        do {
          iVar6 = iVar6 + (int)this->fir[iVar9 * iVar8 + lVar10] *
                          (int)this->sample[(long)this->sample_index + ((lVar10 + 0x4000) - lVar3)];
          lVar10 = lVar10 + 1;
        } while (lVar3 != lVar10);
      }
      iVar9 = iVar9 + 1;
      iVar2 = iVar9;
      if (iVar9 == iVar11) {
        iVar2 = iVar7;
      }
      if (0 < iVar8) {
        lVar10 = 0;
        iVar7 = 0;
        do {
          iVar7 = iVar7 + (int)this->fir[iVar2 * iVar8 + lVar10] *
                          (int)this->sample
                               [(long)this->sample_index +
                                (((ulong)(iVar9 != iVar11) + lVar10 + 0x3fff) - lVar3)];
          lVar10 = lVar10 + 1;
        } while (lVar3 != lVar10);
      }
      iVar11 = ((int)((iVar7 - iVar6) * (uVar12 & 0xffff)) >> 0x10) + iVar6 >> 0xf;
      if (iVar11 < -0x7fff) {
        iVar11 = -0x8000;
      }
      if (0x7ffe < iVar11) {
        iVar11 = 0x7fff;
      }
      buf[iVar5 * interleave] = (short)iVar11;
      iVar8 = 0;
      iVar11 = local_4c;
      iVar5 = iVar5 + 1;
    }
    local_4c = iVar11;
  } while (iVar8 == 0);
  if (iVar8 == 2) {
    iVar11 = *delta_t;
    if (0 < iVar11) {
      iVar8 = 0;
      do {
        clock(this);
        iVar11 = (this->extfilt).Vo;
        lVar3 = (long)iVar11;
        sVar4 = (short)(uint)((ulong)(lVar3 * 0x2e8ba2e9) >> 0x21) - (short)(iVar11 >> 0x1f);
        if (lVar3 < -0x5800a) {
          sVar4 = -0x8000;
        }
        if (0x57fff < lVar3) {
          sVar4 = 0x7fff;
        }
        psVar1 = this->sample;
        iVar11 = this->sample_index;
        psVar1[(long)iVar11 + 0x4000] = sVar4;
        psVar1[iVar11] = sVar4;
        this->sample_index = iVar11 + 1U & 0x3fff;
        iVar8 = iVar8 + 1;
        iVar11 = *delta_t;
      } while (iVar8 < iVar11);
    }
    this->sample_offset = this->sample_offset + iVar11 * -0x10000;
    *delta_t = 0;
    local_4c = iVar5;
  }
  return local_4c;
}

Assistant:

RESID_INLINE
int SID::clock_resample_interpolate(cycle_count& delta_t, short* buf, int n,
				    int interleave)
{
  int s = 0;

  for (;;) {
    cycle_count next_sample_offset = sample_offset + cycles_per_sample;
    cycle_count delta_t_sample = next_sample_offset >> FIXP_SHIFT;
    if (delta_t_sample > delta_t) {
      break;
    }
    if (s >= n) {
      return s;
    }
    for (int i = 0; i < delta_t_sample; i++) {
      clock();
      sample[sample_index] = sample[sample_index + RINGSIZE] = output();
      ++sample_index;
      sample_index &= 0x3fff;
    }
    delta_t -= delta_t_sample;
    sample_offset = next_sample_offset & FIXP_MASK;

    int fir_offset = sample_offset*fir_RES >> FIXP_SHIFT;
    int fir_offset_rmd = sample_offset*fir_RES & FIXP_MASK;
    short* fir_start = fir + fir_offset*fir_N;
    short* sample_start = sample + sample_index - fir_N + RINGSIZE;

    // Convolution with filter impulse response.
    int v1 = 0;
    for (int j = 0; j < fir_N; j++) {
      v1 += sample_start[j]*fir_start[j];
    }

    // Use next FIR table, wrap around to first FIR table using
    // previous sample.
    if (++fir_offset == fir_RES) {
      fir_offset = 0;
      --sample_start;
    }
    fir_start = fir + fir_offset*fir_N;

    // Convolution with filter impulse response.
    int v2 = 0;
    for (int j = 0; j < fir_N; j++) {
      v2 += sample_start[j]*fir_start[j];
    }

    // Linear interpolation.
    // fir_offset_rmd is equal for all samples, it can thus be factorized out:
    // sum(v1 + rmd*(v2 - v1)) = sum(v1) + rmd*(sum(v2) - sum(v1))
    int v = v1 + (fir_offset_rmd*(v2 - v1) >> FIXP_SHIFT);

    v >>= FIR_SHIFT;

    // Saturated arithmetics to guard against 16 bit sample overflow.
    const int half = 1 << 15;
    if (v >= half) {
      v = half - 1;
    }
    else if (v < -half) {
      v = -half;
    }

    buf[s++*interleave] = v;
  }

  for (int i = 0; i < delta_t; i++) {
    clock();
    sample[sample_index] = sample[sample_index + RINGSIZE] = output();
    ++sample_index;
    sample_index &= 0x3fff;
  }
  sample_offset -= delta_t << FIXP_SHIFT;
  delta_t = 0;
  return s;
}